

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O1

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>::clear
          (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMi<4>_> *this)

{
  long *plVar1;
  void *ptr;
  long lVar2;
  ulong uVar3;
  
  lVar2 = *(long *)(*(long *)(this + 0x28) + 0x200);
  if (*(long *)(*(long *)(this + 0x28) + 0x208) != lVar2) {
    uVar3 = 0;
    do {
      plVar1 = *(long **)(lVar2 + uVar3 * 8);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x28))();
      }
      uVar3 = uVar3 + 1;
      lVar2 = *(long *)(*(long *)(this + 0x28) + 0x200);
    } while (uVar3 < (ulong)(*(long *)(*(long *)(this + 0x28) + 0x208) - lVar2 >> 3));
  }
  lVar2 = *(long *)(this + 0x10);
  if (*(long *)(this + 0x18) != lVar2) {
    uVar3 = 0;
    do {
      plVar1 = *(long **)(lVar2 + uVar3 * 8);
      if (plVar1 != (long *)0x0) {
        *(undefined8 *)(lVar2 + uVar3 * 8) = 0;
        (**(code **)(*plVar1 + 8))();
      }
      uVar3 = uVar3 + 1;
      lVar2 = *(long *)(this + 0x10);
    } while (uVar3 < (ulong)(*(long *)(this + 0x18) - lVar2 >> 3));
  }
  lVar2 = *(long *)(this + 0x50);
  ptr = *(void **)(this + 0x58);
  if (ptr != (void *)0x0) {
    if ((ulong)(lVar2 << 6) < 0x1c00000) {
      alignedFree(ptr);
    }
    else {
      os_free(ptr,lVar2 << 6,(bool)this[0x40]);
    }
  }
  if (lVar2 != 0) {
    (**(code **)**(undefined8 **)(this + 0x38))(*(undefined8 **)(this + 0x38),lVar2 * -0x40,1);
  }
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  return;
}

Assistant:

void BVHNBuilderTwoLevel<N,Mesh,Primitive>::clear()
    {
      for (size_t i=0; i<bvh->objects.size(); i++) 
        if (bvh->objects[i]) bvh->objects[i]->clear();

      for (size_t i=0; i<builders.size(); i++) 
        if (builders[i]) builders[i].reset();

      refs.clear();
    }